

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

void llama_sampler_softmax_impl(llama_token_data_array *cur_p)

{
  llama_token_data *plVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  llama_token lVar5;
  long lVar6;
  llama_token_data *plVar7;
  llama_token_data *plVar8;
  llama_token_data *plVar9;
  float *pfVar10;
  llama_token_data *__i;
  llama_token_data *plVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  
  uVar12 = cur_p->size;
  if (uVar12 == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
               ,0xcc,"GGML_ASSERT(%s) failed","cur_p->size > 0");
  }
  plVar8 = cur_p->data;
  if (cur_p->sorted == false) {
    plVar1 = plVar8 + uVar12;
    lVar6 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<llama_token_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_softmax_impl(llama_token_data_array*)::__0>>
              (plVar8,plVar1,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)uVar12 < 0x11) {
      std::
      __insertion_sort<llama_token_data*,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_softmax_impl(llama_token_data_array*)::__0>>
                (plVar8,plVar1);
    }
    else {
      plVar11 = plVar8 + 0x10;
      std::
      __insertion_sort<llama_token_data*,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_softmax_impl(llama_token_data_array*)::__0>>
                (plVar8,plVar11);
      do {
        lVar5 = plVar11->id;
        uVar3 = plVar11->logit;
        uVar4 = plVar11->p;
        plVar8 = plVar11;
        plVar9 = plVar11;
        if (plVar11[-1].logit <= (float)uVar3 && (float)uVar3 != plVar11[-1].logit) {
          do {
            plVar8 = plVar9 + -1;
            plVar9->p = plVar9[-1].p;
            fVar2 = plVar9[-1].logit;
            plVar9->id = plVar9[-1].id;
            plVar9->logit = fVar2;
            plVar7 = plVar9 + -2;
            plVar9 = plVar8;
          } while (plVar7->logit <= (float)uVar3 && (float)uVar3 != plVar7->logit);
        }
        plVar8->id = lVar5;
        plVar8->logit = (float)uVar3;
        plVar8->p = (float)uVar4;
        plVar11 = plVar11 + 1;
      } while (plVar11 != plVar1);
    }
    cur_p->sorted = true;
    uVar12 = cur_p->size;
    if (uVar12 == 0) {
      return;
    }
    plVar8 = cur_p->data;
  }
  fVar2 = plVar8->logit;
  pfVar10 = &plVar8->p;
  fVar15 = 0.0;
  uVar13 = uVar12;
  do {
    fVar14 = expf(pfVar10[-1] - fVar2);
    *pfVar10 = fVar14;
    fVar15 = fVar15 + fVar14;
    pfVar10 = pfVar10 + 3;
    uVar13 = uVar13 - 1;
  } while (uVar13 != 0);
  pfVar10 = &plVar8->p;
  do {
    *pfVar10 = *pfVar10 / fVar15;
    pfVar10 = pfVar10 + 3;
    uVar12 = uVar12 - 1;
  } while (uVar12 != 0);
  return;
}

Assistant:

static void llama_sampler_softmax_impl(llama_token_data_array * cur_p) {
    GGML_ASSERT(cur_p->size > 0);

    // Sort the logits in descending order
    if (!cur_p->sorted) {
        std::sort(cur_p->data, cur_p->data + cur_p->size, [](const llama_token_data & a, const llama_token_data & b) {
            return a.logit > b.logit;
        });
        cur_p->sorted = true;
    }

    float max_l = cur_p->data[0].logit;
    float cum_sum = 0.0f;

    for (size_t i = 0; i < cur_p->size; ++i) {
        float p = expf(cur_p->data[i].logit - max_l);
        cur_p->data[i].p = p;
        cum_sum += p;
    }

    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].p /= cum_sum;
    }
}